

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O0

bool __thiscall
DyndepLoader::LoadDyndepFile(DyndepLoader *this,Node *file,DyndepFile *ddf,string *err)

{
  bool bVar1;
  string *filename;
  undefined1 local_e8 [8];
  DyndepParser parser;
  string *err_local;
  DyndepFile *ddf_local;
  Node *file_local;
  DyndepLoader *this_local;
  
  parser.env_.parent_ = (BindingEnv *)err;
  DyndepParser::DyndepParser
            ((DyndepParser *)local_e8,this->state_,(FileReader *)this->disk_interface_,ddf);
  filename = Node::path_abi_cxx11_(file);
  bVar1 = Parser::Load((Parser *)local_e8,filename,(string *)parser.env_.parent_,(Lexer *)0x0);
  DyndepParser::~DyndepParser((DyndepParser *)local_e8);
  return bVar1;
}

Assistant:

bool DyndepLoader::LoadDyndepFile(Node* file, DyndepFile* ddf,
                                  std::string* err) const {
  DyndepParser parser(state_, disk_interface_, ddf);
  return parser.Load(file->path(), err);
}